

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::TestCaseStats::TestCaseStats
          (TestCaseStats *this,TestCaseInfo *_testInfo,Totals *_totals,string *_stdOut,
          string *_stdErr,bool _aborting)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  undefined8 uVar11;
  
  this->testInfo = _testInfo;
  uVar4 = (_totals->assertions).failed;
  uVar5 = (_totals->assertions).failedButOk;
  uVar6 = (_totals->assertions).skipped;
  uVar7 = (_totals->testCases).passed;
  uVar8 = (_totals->testCases).failed;
  uVar9 = (_totals->testCases).failedButOk;
  uVar10 = (_totals->testCases).skipped;
  (this->totals).assertions.passed = (_totals->assertions).passed;
  (this->totals).assertions.failed = uVar4;
  (this->totals).assertions.failedButOk = uVar5;
  (this->totals).assertions.skipped = uVar6;
  (this->totals).testCases.passed = uVar7;
  (this->totals).testCases.failed = uVar8;
  (this->totals).testCases.failedButOk = uVar9;
  (this->totals).testCases.skipped = uVar10;
  paVar1 = &(this->stdOut).field_2;
  (this->stdOut)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (_stdOut->_M_dataplus)._M_p;
  paVar2 = &_stdOut->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar11 = *(undefined8 *)((long)&_stdOut->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->stdOut).field_2 + 8) = uVar11;
  }
  else {
    (this->stdOut)._M_dataplus._M_p = pcVar3;
    (this->stdOut).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->stdOut)._M_string_length = _stdOut->_M_string_length;
  (_stdOut->_M_dataplus)._M_p = (pointer)paVar2;
  _stdOut->_M_string_length = 0;
  (_stdOut->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->stdErr).field_2;
  (this->stdErr)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (_stdErr->_M_dataplus)._M_p;
  paVar2 = &_stdErr->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar11 = *(undefined8 *)((long)&_stdErr->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->stdErr).field_2 + 8) = uVar11;
  }
  else {
    (this->stdErr)._M_dataplus._M_p = pcVar3;
    (this->stdErr).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->stdErr)._M_string_length = _stdErr->_M_string_length;
  (_stdErr->_M_dataplus)._M_p = (pointer)paVar2;
  _stdErr->_M_string_length = 0;
  (_stdErr->field_2)._M_local_buf[0] = '\0';
  this->aborting = _aborting;
  return;
}

Assistant:

TestCaseStats::TestCaseStats(  TestCaseInfo const& _testInfo,
                                   Totals const& _totals,
                                   std::string&& _stdOut,
                                   std::string&& _stdErr,
                                   bool _aborting )
    : testInfo( &_testInfo ),
        totals( _totals ),
        stdOut( CATCH_MOVE(_stdOut) ),
        stdErr( CATCH_MOVE(_stdErr) ),
        aborting( _aborting )
    {}